

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(connectdata *conn,char *enclist,int maybechunked)

{
  undefined1 *puVar1;
  byte bVar2;
  Curl_easy *pCVar3;
  bool bVar4;
  int iVar5;
  contenc_writer *pcVar6;
  size_t sVar7;
  content_encoding **ppcVar8;
  size_t max;
  content_encoding *ce;
  content_encoding *pcVar9;
  byte *pbVar10;
  content_encoding *handler;
  
  pCVar3 = conn->data;
  do {
    while( true ) {
      handler = (content_encoding *)(ulong)(uint)maybechunked;
      iVar5 = Curl_isspace((uint)(byte)*enclist);
      if ((iVar5 == 0) && (*enclist != 0x2c)) break;
      enclist = (char *)((byte *)enclist + 1);
    }
    sVar7 = 1;
    max = 0;
    for (pbVar10 = (byte *)enclist; (bVar2 = *pbVar10, bVar2 != 0 && (bVar2 != 0x2c));
        pbVar10 = pbVar10 + 1) {
      iVar5 = Curl_isspace((uint)bVar2);
      if (iVar5 == 0) {
        max = sVar7;
      }
      sVar7 = sVar7 + 1;
    }
    if (((maybechunked == 0) || (max != 7)) ||
       (iVar5 = Curl_strncasecompare(enclist,"chunked",7), iVar5 == 0)) {
      if (max != 0) {
        ppcVar8 = encodings;
        pcVar9 = &identity_encoding;
        do {
          ppcVar8 = ppcVar8 + 1;
          iVar5 = Curl_strncasecompare(enclist,pcVar9->name,max);
          if (((iVar5 == 0) || (pcVar9->name[max] != '\0')) &&
             ((pcVar9->alias == (char *)0x0 ||
              ((iVar5 = Curl_strncasecompare(enclist,pcVar9->alias,max), iVar5 == 0 ||
               (pcVar9->alias[max] != '\0')))))) {
            bVar4 = true;
          }
          else {
            bVar4 = false;
            handler = pcVar9;
          }
          if (!bVar4) goto LAB_0012cec2;
          pcVar9 = *ppcVar8;
        } while (pcVar9 != (content_encoding *)0x0);
        handler = (content_encoding *)0x0;
LAB_0012cec2:
        if ((pCVar3->req).writer_stack == (contenc_writer_s *)0x0) {
          pcVar6 = new_unencoding_writer(conn,&client_encoding,(contenc_writer *)0x0);
          (pCVar3->req).writer_stack = pcVar6;
          if (pcVar6 == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (handler == (content_encoding *)0x0) {
          handler = &error_encoding;
        }
        pcVar6 = new_unencoding_writer(conn,handler,(pCVar3->req).writer_stack);
        if (pcVar6 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pCVar3->req).writer_stack = pcVar6;
      }
    }
    else {
      puVar1 = &(pCVar3->req).field_0x570;
      *puVar1 = *puVar1 | 0x20;
      Curl_httpchunk_init(conn);
    }
    enclist = (char *)pbVar10;
    if (*pbVar10 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct connectdata *conn,
                                     const char *enclist, int maybechunked)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(conn);   /* init our chunky engine. */
    }
    else if(namelen) {
      const content_encoding *encoding = find_encoding(name, namelen);
      contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(conn, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(conn, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}